

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::EntryPointInfo::DoLazyBailout
          (EntryPointInfo *this,BYTE **addressOfInstructionPointer,BYTE *framePointer,
          FunctionBody *functionBody,PropertyRecord *propertyRecord)

{
  JavascriptMethod p_Var1;
  code *pcVar2;
  bool bVar3;
  int index;
  uint32 uVar4;
  int32 iVar5;
  NativeEntryPointData *this_00;
  JavascriptMethod p_Var6;
  ptrdiff_t pVar7;
  undefined4 *puVar8;
  InProcNativeEntryPointData *pIVar9;
  NativeLazyBailOutRecordList *this_01;
  Type *this_02;
  char16 *pcVar10;
  BYTE *addressOfLazyBailOutRecordSlot;
  BYTE *lazyBailOutThunkAddress;
  uint32 lazyBailOutThunkOffset;
  LazyBailOutRecord *record;
  InProcNativeEntryPointData *inProcNativeEntryPointData;
  int found;
  NativeLazyBailOutRecordList *bailOutRecordList;
  size_t offset;
  ptrdiff_t codeSize;
  JavascriptMethod nativeAddress;
  NativeEntryPointData *nativeEntryPointData;
  BYTE *instructionPointer;
  PropertyRecord *propertyRecord_local;
  FunctionBody *functionBody_local;
  BYTE *framePointer_local;
  BYTE **addressOfInstructionPointer_local;
  EntryPointInfo *this_local;
  
  p_Var1 = (JavascriptMethod)*addressOfInstructionPointer;
  this_00 = GetNativeEntryPointData(this);
  p_Var6 = NativeEntryPointData::GetNativeAddress(this_00);
  pVar7 = NativeEntryPointData::GetCodeSize(this_00);
  if ((p_Var1 <= p_Var6) || (p_Var6 + pVar7 <= p_Var1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2259,
                                "(instructionPointer > (BYTE*)nativeAddress && instructionPointer < ((BYTE*)nativeAddress + codeSize))"
                                ,
                                "instructionPointer > (BYTE*)nativeAddress && instructionPointer < ((BYTE*)nativeAddress + codeSize)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pIVar9 = GetInProcNativeEntryPointData(this);
  this_01 = InProcNativeEntryPointData::GetSortedLazyBailOutRecordList(pIVar9);
  if (this_01 == (NativeLazyBailOutRecordList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x225d,"(bailOutRecordList != nullptr)",
                                "Lazy Bailout: bailOutRecordList is missing");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  index = JsUtil::ReadOnlyList<LazyBailOutRecord,Memory::HeapAllocator,DefaultComparer>::
          BinarySearch<Js::EntryPointInfo::DoLazyBailout(unsigned_char**,unsigned_char*,Js::FunctionBody*,Js::PropertyRecord_const*)::__0>
                    ((ReadOnlyList<LazyBailOutRecord,Memory::HeapAllocator,DefaultComparer> *)
                     this_01,(anon_class_8_1_645b55d1)((long)p_Var1 - (long)p_Var6));
  if (index == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2289,"(false)","Lazy Bailout: Address mapping missing");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  else {
    pIVar9 = GetInProcNativeEntryPointData(this);
    this_02 = JsUtil::
              List<LazyBailOutRecord,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_01,index);
    uVar4 = InProcNativeEntryPointData::GetLazyBailOutThunkOffset(pIVar9);
    *addressOfInstructionPointer = (BYTE *)(p_Var6 + uVar4);
    iVar5 = InProcNativeEntryPointData::GetLazyBailOutRecordSlotOffset(pIVar9);
    *(BailOutRecord **)(framePointer + iVar5) = this_02->bailOutRecord;
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,LazyBailoutPhase);
    if (bVar3) {
      pcVar10 = PropertyRecord::GetBuffer(propertyRecord);
      Output::Print(L"On stack lazy bailout. Property: %s Old IP: 0x%x New IP: 0x%x ",pcVar10,p_Var1
                    ,p_Var6 + uVar4);
      LazyBailOutRecord::Dump(this_02,functionBody);
      Output::Print(L"\n");
    }
  }
  return;
}

Assistant:

void EntryPointInfo::DoLazyBailout(
        BYTE **addressOfInstructionPointer,
        BYTE *framePointer
#if DBG
        , Js::FunctionBody *functionBody
        , const PropertyRecord *propertyRecord
#endif
    )
    {
        BYTE* instructionPointer = *addressOfInstructionPointer;
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        Js::JavascriptMethod nativeAddress = nativeEntryPointData->GetNativeAddress();
        ptrdiff_t codeSize = nativeEntryPointData->GetCodeSize();
        Assert(instructionPointer > (BYTE*)nativeAddress && instructionPointer < ((BYTE*)nativeAddress + codeSize));
        size_t offset = instructionPointer - (BYTE*)nativeAddress;
        NativeLazyBailOutRecordList * bailOutRecordList = this->GetInProcNativeEntryPointData()->GetSortedLazyBailOutRecordList();

        AssertMsg(bailOutRecordList != nullptr, "Lazy Bailout: bailOutRecordList is missing");

        int found = bailOutRecordList->BinarySearch([=](const LazyBailOutRecord& record, int index)
        {
            if (record.offset == offset)
            {
                return 0;
            }
            else if (record.offset > offset)
            {
                return 1;
            }
            else
            {
                return -1;
            }
        });

        if (found != -1)
        {
            auto inProcNativeEntryPointData = this->GetInProcNativeEntryPointData();
            const LazyBailOutRecord& record = bailOutRecordList->Item(found);
            const uint32 lazyBailOutThunkOffset = inProcNativeEntryPointData->GetLazyBailOutThunkOffset();
            BYTE * const lazyBailOutThunkAddress = (BYTE *) nativeAddress + lazyBailOutThunkOffset;

            // Change the instruction pointer of the frame to our thunk so that
            // when execution returns back to this frame, we will execute the thunk instead
            *addressOfInstructionPointer = lazyBailOutThunkAddress;

            // Put the BailOutRecord corresponding to our LazyBailOut point on the pre-allocated slot on the stack
            BYTE *addressOfLazyBailOutRecordSlot = framePointer + inProcNativeEntryPointData->GetLazyBailOutRecordSlotOffset();
            *(reinterpret_cast<intptr_t *>(addressOfLazyBailOutRecordSlot)) = reinterpret_cast<intptr_t>(record.bailOutRecord);
            
            if (PHASE_TRACE1(Js::LazyBailoutPhase))
            {
#if DBG
                Output::Print(_u("On stack lazy bailout. Property: %s Old IP: 0x%x New IP: 0x%x "), propertyRecord->GetBuffer(), instructionPointer, lazyBailOutThunkAddress);
                record.Dump(functionBody);
                Output::Print(_u("\n"));
#endif
            }
        }
        else
        {
            AssertMsg(false, "Lazy Bailout: Address mapping missing");
        }
    }